

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::timestamp_ms_t,duckdb::timestamp_ms_t>
                   (timestamp_ms_t input)

{
  bool bVar1;
  undefined8 in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  string local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  timestamp_ms_t in_stack_fffffffffffffe28;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [7];
  PhysicalType in_stack_fffffffffffffedf;
  string local_108 [32];
  undefined8 local_e8;
  string local_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = TypeIsNumber<duckdb::timestamp_ms_t>();
  if ((bVar1) && (bVar1 = TypeIsNumber<duckdb::timestamp_ms_t>(), bVar1)) {
    GetTypeId<duckdb::timestamp_ms_t>();
    pbVar2 = &local_b0;
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((char *)pbVar2,in_stack_fffffffffffffdf0);
    ::std::operator+(pbVar2,(char *)in_stack_fffffffffffffdf0);
    local_e8 = local_10;
    ConvertToString::Operation<duckdb::timestamp_ms_t>(in_stack_fffffffffffffe28);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28.super_timestamp_t.value,in_stack_fffffffffffffe20);
    ::std::operator+(pbVar2,(char *)in_stack_fffffffffffffdf0);
    GetTypeId<duckdb::timestamp_ms_t>();
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28.super_timestamp_t.value,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string(local_30);
    ::std::__cxx11::string::~string(local_50);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string(local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    GetTypeId<duckdb::timestamp_ms_t>();
    pbVar2 = &local_1a8;
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((char *)in_stack_fffffffffffffdf8,pbVar2);
    ::std::operator+(in_stack_fffffffffffffdf8,(char *)pbVar2);
    ConvertToString::Operation<duckdb::timestamp_ms_t>(in_stack_fffffffffffffe28);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28.super_timestamp_t.value,in_stack_fffffffffffffe20);
    ::std::operator+(in_stack_fffffffffffffdf8,(char *)pbVar2);
    GetTypeId<duckdb::timestamp_ms_t>();
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28.super_timestamp_t.value,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::__cxx11::string::~string(local_128);
    ::std::__cxx11::string::~string(local_148);
    ::std::__cxx11::string::~string(local_1c8);
    ::std::__cxx11::string::~string(local_168);
    ::std::__cxx11::string::~string(local_188);
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}